

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

command_result_status
bgp_command(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *command_params)

{
  pointer pbVar1;
  int iVar2;
  command_result_status cVar3;
  
  pbVar1 = (command_params->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cVar3 = INVALID_PARAMS;
  if (0x20 < (ulong)((long)(command_params->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    iVar2 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
    if (iVar2 == 0) {
      cVar3 = bgp_route_command(command_params);
      return cVar3;
    }
    iVar2 = std::__cxx11::string::compare
                      ((char *)((command_params->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar2 == 0) {
      bgp_statistic_command();
      cVar3 = SUCCESS;
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((command_params->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar2 == 0) {
        cVar3 = bgp_neighbor_command(command_params);
        return cVar3;
      }
    }
  }
  return cVar3;
}

Assistant:

command_result_status bgp_command(const std::vector<std::string>& command_params){
    size_t param_count = command_params.size();
    if(param_count < 2){
        return command_result_status::INVALID_PARAMS;
    }
    if(command_params[1] == "route"){ // bgp route
        return bgp_route_command(command_params);
    }else if(command_params[1] == "statistics"){ // bgp statistics
        return bgp_statistic_command();
    }else if(command_params[1] == "neighbor"){ // bgp neighbor
        return bgp_neighbor_command(command_params);
    }

    return command_result_status::INVALID_PARAMS;
}